

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Dist_graph_create
              (MPIABI_Comm comm_old,int n,int *sources,int *degrees,int *destinations,int *weights,
              MPIABI_Info info,int reorder,MPIABI_Comm *comm_dist_graph)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  ompi_communicator_t *poVar6;
  ompi_info_t *poVar7;
  ompi_communicator_t **ppoVar8;
  WPI_HandlePtr<ompi_communicator_t_*> local_58;
  WPI_Handle local_50 [8];
  WPI_Handle local_48 [8];
  int *local_40;
  int *weights_local;
  int *destinations_local;
  int *degrees_local;
  int *sources_local;
  MPIABI_Comm MStack_18;
  int n_local;
  MPIABI_Comm comm_old_local;
  
  local_40 = weights;
  weights_local = destinations;
  destinations_local = degrees;
  degrees_local = sources;
  sources_local._4_4_ = n;
  MStack_18 = comm_old;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_48,comm_old);
  poVar6 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_48);
  iVar5 = sources_local._4_4_;
  piVar4 = degrees_local;
  piVar3 = destinations_local;
  piVar2 = weights_local;
  piVar1 = local_40;
  WPI_Handle<ompi_info_t_*>::WPI_Handle((WPI_Handle<ompi_info_t_*> *)local_50,info);
  poVar7 = WPI_Handle::operator_cast_to_ompi_info_t_(local_50);
  WPI_HandlePtr<ompi_communicator_t_*>::WPI_HandlePtr(&local_58,comm_dist_graph);
  ppoVar8 = WPI_HandlePtr::operator_cast_to_ompi_communicator_t__((WPI_HandlePtr *)&local_58);
  iVar5 = MPI_Dist_graph_create(poVar6,iVar5,piVar4,piVar3,piVar2,piVar1,poVar7,reorder,ppoVar8);
  WPI_HandlePtr<ompi_communicator_t_*>::~WPI_HandlePtr(&local_58);
  return iVar5;
}

Assistant:

int MPIABI_Dist_graph_create(
  MPIABI_Comm comm_old,
  int n,
  const int * sources,
  const int * degrees,
  const int * destinations,
  const int * weights,
  MPIABI_Info info,
  int reorder,
  MPIABI_Comm * comm_dist_graph
) {
  return MPI_Dist_graph_create(
    (MPI_Comm)(WPI_Comm)comm_old,
    n,
    sources,
    degrees,
    destinations,
    weights,
    (MPI_Info)(WPI_Info)info,
    reorder,
    (MPI_Comm *)(WPI_CommPtr)comm_dist_graph
  );
}